

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<double,_3,_3> * tcu::operator*(Matrix<double,_3,_1> *a,Matrix<double,_1,_3> *b)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Vector<double,_3> *pVVar4;
  int row_1;
  long lVar5;
  Vector<double,_3> *in_RDI;
  Vector<double,_3> *pVVar6;
  int row;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  bool bVar11;
  undefined8 uVar12;
  long lVar10;
  
  pVVar4 = in_RDI;
  in_RDI[2].m_data[0] = 0;
  *(undefined8 *)((long)(in_RDI + 2) + 8) = 0;
  in_RDI[1].m_data[1] = 0.0;
  in_RDI[1].m_data[2] = 0.0;
  in_RDI->m_data[2] = 0.0;
  in_RDI[1].m_data[0] = 0.0;
  in_RDI->m_data[0] = 0.0;
  in_RDI->m_data[1] = 0.0;
  *(undefined8 *)((long)(in_RDI + 2) + 0x10) = 0;
  auVar3 = _DAT_019fcc00;
  auVar2 = _DAT_019f5ce0;
  lVar5 = 0;
  lVar7 = 0;
  pVVar6 = in_RDI;
  do {
    lVar8 = 0;
    auVar9 = auVar3;
    do {
      bVar11 = SUB164(auVar9 ^ auVar2,4) == -0x80000000 && SUB164(auVar9 ^ auVar2,0) < -0x7ffffffd;
      if (bVar11) {
        uVar12 = 0x3ff0000000000000;
        if (lVar5 != lVar8) {
          uVar12 = 0;
        }
        *(undefined8 *)((long)pVVar6->m_data + lVar8) = uVar12;
      }
      if (bVar11) {
        uVar12 = 0x3ff0000000000000;
        if (lVar5 + -0x18 != lVar8) {
          uVar12 = 0;
        }
        *(undefined8 *)((long)pVVar6[1].m_data + lVar8) = uVar12;
      }
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar10 + 2;
      lVar8 = lVar8 + 0x30;
    } while (lVar8 != 0x60);
    lVar7 = lVar7 + 1;
    lVar5 = lVar5 + 0x18;
    pVVar6 = (Vector<double,_3> *)(pVVar6->m_data + 1);
  } while (lVar7 != 3);
  lVar5 = 0;
  do {
    dVar1 = (a->m_data).m_data[0].m_data[lVar5];
    lVar7 = 0;
    pVVar6 = in_RDI;
    do {
      ((Vector<tcu::Vector<double,_3>,_3> *)pVVar6->m_data)->m_data[0].m_data[0] =
           (b->m_data).m_data[lVar7].m_data[0] * dVar1 + 0.0;
      lVar7 = lVar7 + 1;
      pVVar6 = pVVar6 + 1;
    } while (lVar7 != 3);
    lVar5 = lVar5 + 1;
    in_RDI = (Vector<double,_3> *)(in_RDI->m_data + 1);
  } while (lVar5 != 3);
  return (Matrix<double,_3,_3> *)pVVar4;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}